

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O0

void __thiscall QTabBar::setTabsClosable(QTabBar *this,bool closable)

{
  Tab *pTVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  QTabBarPrivate *sender;
  QStyle *pQVar5;
  const_iterator o;
  Tab **ppTVar6;
  QWidget *parent;
  qsizetype qVar7;
  QWidget *pQVar8;
  byte in_SIL;
  CloseButton *in_RDI;
  long in_FS_OFFSET;
  QTabBarPrivate *in_stack_00000038;
  QAbstractButton *closeButton;
  int i;
  bool newButtons;
  Tab *tab;
  add_const_t<QList<QTabBarPrivate::Tab_*>_> *__range2;
  ButtonPosition closeSide;
  QTabBarPrivate *d;
  const_iterator __end2;
  const_iterator __begin2;
  code *in_stack_ffffffffffffff48;
  QList<QTabBarPrivate::Tab_*> *in_stack_ffffffffffffff50;
  QWidget *in_stack_ffffffffffffff60;
  int local_70;
  undefined8 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  Connection local_28;
  offset_in_QAbstractButton_to_subr in_stack_ffffffffffffffe0;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_SIL & 1;
  sender = d_func((QTabBar *)0x6b3a09);
  if (((byte)(*(ushort *)&sender->field_0x2d0 >> 6) & 1) != bVar2) {
    *(ushort *)&sender->field_0x2d0 = *(ushort *)&sender->field_0x2d0 & 0xffbf | (ushort)bVar2 << 6;
    pQVar5 = QWidget::style((QWidget *)in_stack_ffffffffffffff48);
    iVar4 = (**(code **)(*(long *)pQVar5 + 0xf0))(pQVar5,0x5c,0,in_RDI);
    if (bVar2 == 0) {
      local_10.i = (Tab **)&DAT_aaaaaaaaaaaaaaaa;
      local_10 = QList<QTabBarPrivate::Tab_*>::begin(in_stack_ffffffffffffff50);
      o = QList<QTabBarPrivate::Tab_*>::end(in_stack_ffffffffffffff50);
      while (bVar3 = QList<QTabBarPrivate::Tab_*>::const_iterator::operator!=(&local_10,o), bVar3) {
        ppTVar6 = QList<QTabBarPrivate::Tab_*>::const_iterator::operator*(&local_10);
        pTVar1 = *ppTVar6;
        if ((iVar4 == 0) && (pTVar1->leftWidget != (QWidget *)0x0)) {
          QObject::deleteLater();
          pTVar1->leftWidget = (QWidget *)0x0;
        }
        if ((iVar4 == 1) && (pTVar1->rightWidget != (QWidget *)0x0)) {
          QObject::deleteLater();
          pTVar1->rightWidget = (QWidget *)0x0;
        }
        QList<QTabBarPrivate::Tab_*>::const_iterator::operator++(&local_10);
      }
    }
    else {
      bVar3 = false;
      local_70 = 0;
      while( true ) {
        parent = (QWidget *)(long)local_70;
        qVar7 = QList<QTabBarPrivate::Tab_*>::size(&sender->tabList);
        if (qVar7 <= (long)parent) break;
        pQVar8 = tabButton((QTabBar *)parent,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                           (ButtonPosition)in_stack_ffffffffffffff60);
        if (pQVar8 == (QWidget *)0x0) {
          bVar3 = true;
          in_stack_ffffffffffffff60 = (QWidget *)operator_new(0x28);
          anon_unknown.dwarf_e10892::CloseButton::CloseButton(in_RDI,parent);
          in_stack_ffffffffffffff48 = QTabBarPrivate::closeTab;
          QObjectPrivate::connect<void(QAbstractButton::*)(bool),void(QTabBarPrivate::*)()>
                    ((Object *)sender,in_stack_ffffffffffffffe0,
                     (Object *)CONCAT44(iVar4,in_stack_ffffffffffffffa8),0,
                     (ConnectionType)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
          QMetaObject::Connection::~Connection(&local_28);
          setTabButton((QTabBar *)in_RDI,(int)((ulong)parent >> 0x20),(ButtonPosition)parent,
                       in_stack_ffffffffffffff60);
        }
        local_70 = local_70 + 1;
      }
      if (bVar3) {
        QTabBarPrivate::layoutTabs(in_stack_00000038);
      }
    }
    QWidget::update((QWidget *)in_stack_ffffffffffffff48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTabBar::setTabsClosable(bool closable)
{
    Q_D(QTabBar);
    if (d->closeButtonOnTabs == closable)
        return;
    d->closeButtonOnTabs = closable;
    ButtonPosition closeSide = (ButtonPosition)style()->styleHint(QStyle::SH_TabBar_CloseButtonPosition, nullptr, this);
    if (!closable) {
        for (auto tab : std::as_const(d->tabList)) {
            if (closeSide == LeftSide && tab->leftWidget) {
                tab->leftWidget->deleteLater();
                tab->leftWidget = nullptr;
            }
            if (closeSide == RightSide && tab->rightWidget) {
                tab->rightWidget->deleteLater();
                tab->rightWidget = nullptr;
            }
        }
    } else {
        bool newButtons = false;
        for (int i = 0; i < d->tabList.size(); ++i) {
            if (tabButton(i, closeSide))
                continue;
            newButtons = true;
            QAbstractButton *closeButton = new CloseButton(this);
            QObjectPrivate::connect(closeButton, &CloseButton::clicked,
                                    d, &QTabBarPrivate::closeTab);
            setTabButton(i, closeSide, closeButton);
        }
        if (newButtons)
            d->layoutTabs();
    }
    update();
}